

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O1

int anon_unknown.dwarf_747f::RtMidi_callbackwrapper(lua_State *L)

{
  lua_pushvalue(L,0xfff0b9d7);
  lua_pushvalue(L,1);
  lua_pushvalue(L,2);
  lua_pushvalue(L,0xfff0b9d6);
  lua_callk(L,3,0,0,0);
  return 0;
}

Assistant:

int RtMidi_callbackwrapper(lua_State *L) {
	lua_pushvalue(L, lua_upvalueindex(1)); // error callback
	lua_pushvalue(L, 1);
	lua_pushvalue(L, 2);
	lua_pushvalue(L, lua_upvalueindex(2)); // user data
	lua_call(L, 3, 0);
	return 0;
}